

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# API.cpp
# Opt level: O0

__sighandler_t __thiscall
AGSSockAPI::Beacon::signal(Beacon *this,int __sig,__sighandler_t __handler)

{
  __sighandler_t p_Var1;
  undefined1 local_11;
  Beacon *pBStack_10;
  char sig [1];
  Beacon *this_local;
  
  pBStack_10 = this;
  memset(&local_11,0,1);
  p_Var1 = (__sighandler_t)write((this->data).fd[1],&local_11,1);
  return p_Var1;
}

Assistant:

void Beacon::signal()
{
	const char sig[] = "";
#if defined(_WIN32) && (IMPL_MODE == 1)
	send(data.fd, sig, sizeof (sig), 0);
#elif defined(_WIN32) && (IMPL_MODE == 2)
	closesocket(data.fd);
#else
	write(data.fd[1], sig, sizeof (sig));
#endif
}